

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GuillotineBinPack.cpp
# Opt level: O0

void __thiscall GuillotineBinPack::MergeFreeList(GuillotineBinPack *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  Rect *pRVar6;
  uint local_40;
  uint local_3c;
  uint i_2;
  uint j;
  uint i_1;
  uint local_24;
  undefined1 local_20 [4];
  uint i;
  DisjointRectCollection test;
  GuillotineBinPack *this_local;
  
  test.rects._8_8_ = this;
  DisjointRectCollection::DisjointRectCollection((DisjointRectCollection *)local_20);
  for (local_24 = 0; uVar4 = TArray<Rect,_Rect>::Size(&this->freeRectangles), local_24 < uVar4;
      local_24 = local_24 + 1) {
    pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)local_24);
    bVar3 = DisjointRectCollection::Add((DisjointRectCollection *)local_20,pRVar6);
    if (!bVar3) {
      __assert_fail("test.Add(freeRectangles[i]) == true",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/GuillotineBinPack.cpp"
                    ,0x254,"void GuillotineBinPack::MergeFreeList()");
    }
  }
  i_2 = 0;
  do {
    uVar5 = TArray<Rect,_Rect>::Size(&this->freeRectangles);
    uVar4 = i_2;
    if (uVar5 <= i_2) {
      DisjointRectCollection::Clear((DisjointRectCollection *)local_20);
      local_40 = 0;
      while( true ) {
        uVar4 = TArray<Rect,_Rect>::Size(&this->freeRectangles);
        if (uVar4 <= local_40) {
          DisjointRectCollection::~DisjointRectCollection((DisjointRectCollection *)local_20);
          return;
        }
        pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)local_40);
        bVar3 = DisjointRectCollection::Add((DisjointRectCollection *)local_20,pRVar6);
        if (!bVar3) break;
        local_40 = local_40 + 1;
      }
      __assert_fail("test.Add(freeRectangles[i]) == true",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/GuillotineBinPack.cpp"
                    ,0x281,"void GuillotineBinPack::MergeFreeList()");
    }
LAB_003c9565:
    uVar5 = uVar4;
    local_3c = uVar5 + 1;
    uVar4 = TArray<Rect,_Rect>::Size(&this->freeRectangles);
    if (local_3c < uVar4) {
      pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)i_2);
      iVar1 = pRVar6->width;
      pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)local_3c);
      if (iVar1 == pRVar6->width) {
        pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)i_2);
        iVar1 = pRVar6->x;
        pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)local_3c);
        if (iVar1 == pRVar6->x) {
          pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)i_2);
          iVar1 = pRVar6->y;
          pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)local_3c);
          iVar2 = pRVar6->y;
          pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)local_3c);
          if (iVar1 == iVar2 + pRVar6->height) {
            pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)local_3c);
            iVar1 = pRVar6->height;
            pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)i_2);
            pRVar6->y = pRVar6->y - iVar1;
            pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)local_3c);
            iVar1 = pRVar6->height;
            pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)i_2);
            pRVar6->height = pRVar6->height + iVar1;
            TArray<Rect,_Rect>::Delete(&this->freeRectangles,local_3c);
            uVar4 = uVar5;
          }
          else {
            pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)i_2);
            iVar1 = pRVar6->y;
            pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)i_2);
            iVar2 = pRVar6->height;
            pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)local_3c);
            uVar4 = local_3c;
            if (iVar1 + iVar2 == pRVar6->y) {
              pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)local_3c);
              iVar1 = pRVar6->height;
              pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)i_2);
              pRVar6->height = pRVar6->height + iVar1;
              TArray<Rect,_Rect>::Delete(&this->freeRectangles,local_3c);
              uVar4 = uVar5;
            }
          }
          goto LAB_003c9565;
        }
      }
      pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)i_2);
      iVar1 = pRVar6->height;
      pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)local_3c);
      uVar4 = local_3c;
      if (iVar1 == pRVar6->height) {
        pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)i_2);
        iVar1 = pRVar6->y;
        pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)local_3c);
        uVar4 = local_3c;
        if (iVar1 == pRVar6->y) {
          pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)i_2);
          iVar1 = pRVar6->x;
          pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)local_3c);
          iVar2 = pRVar6->x;
          pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)local_3c);
          if (iVar1 == iVar2 + pRVar6->width) {
            pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)local_3c);
            iVar1 = pRVar6->width;
            pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)i_2);
            pRVar6->x = pRVar6->x - iVar1;
            pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)local_3c);
            iVar1 = pRVar6->width;
            pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)i_2);
            pRVar6->width = pRVar6->width + iVar1;
            TArray<Rect,_Rect>::Delete(&this->freeRectangles,local_3c);
            uVar4 = uVar5;
          }
          else {
            pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)i_2);
            iVar1 = pRVar6->x;
            pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)i_2);
            iVar2 = pRVar6->width;
            pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)local_3c);
            uVar4 = local_3c;
            if (iVar1 + iVar2 == pRVar6->x) {
              pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)local_3c);
              iVar1 = pRVar6->width;
              pRVar6 = TArray<Rect,_Rect>::operator[](&this->freeRectangles,(ulong)i_2);
              pRVar6->width = pRVar6->width + iVar1;
              TArray<Rect,_Rect>::Delete(&this->freeRectangles,local_3c);
              uVar4 = uVar5;
            }
          }
        }
      }
      goto LAB_003c9565;
    }
    i_2 = i_2 + 1;
  } while( true );
}

Assistant:

void GuillotineBinPack::MergeFreeList()
{
#ifdef _DEBUG
	DisjointRectCollection test;
	for(unsigned i = 0; i < freeRectangles.Size(); ++i)
		assert(test.Add(freeRectangles[i]) == true);
#endif

	// Do a Theta(n^2) loop to see if any pair of free rectangles could me merged into one.
	// Note that we miss any opportunities to merge three rectangles into one. (should call this function again to detect that)
	for(unsigned i = 0; i < freeRectangles.Size(); ++i)
		for(unsigned j = i+1; j < freeRectangles.Size(); ++j)
		{
			if (freeRectangles[i].width == freeRectangles[j].width && freeRectangles[i].x == freeRectangles[j].x)
			{
				if (freeRectangles[i].y == freeRectangles[j].y + freeRectangles[j].height)
				{
					freeRectangles[i].y -= freeRectangles[j].height;
					freeRectangles[i].height += freeRectangles[j].height;
					freeRectangles.Delete(j);
					--j;
				}
				else if (freeRectangles[i].y + freeRectangles[i].height == freeRectangles[j].y)
				{
					freeRectangles[i].height += freeRectangles[j].height;
					freeRectangles.Delete(j);
					--j;
				}
			}
			else if (freeRectangles[i].height == freeRectangles[j].height && freeRectangles[i].y == freeRectangles[j].y)
			{
				if (freeRectangles[i].x == freeRectangles[j].x + freeRectangles[j].width)
				{
					freeRectangles[i].x -= freeRectangles[j].width;
					freeRectangles[i].width += freeRectangles[j].width;
					freeRectangles.Delete(j);
					--j;
				}
				else if (freeRectangles[i].x + freeRectangles[i].width == freeRectangles[j].x)
				{
					freeRectangles[i].width += freeRectangles[j].width;
					freeRectangles.Delete(j);
					--j;
				}
			}
		}

#ifdef _DEBUG
	test.Clear();
	for(unsigned i = 0; i < freeRectangles.Size(); ++i)
		assert(test.Add(freeRectangles[i]) == true);
#endif
}